

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cert_errors.cc
# Opt level: O0

bool __thiscall
bssl::CertPathErrors::ContainsAnyErrorWithSeverity(CertPathErrors *this,Severity severity)

{
  bool bVar1;
  reference this_00;
  CertErrors *errors;
  const_iterator __end1;
  const_iterator __begin1;
  vector<bssl::CertErrors,_std::allocator<bssl::CertErrors>_> *__range1;
  Severity severity_local;
  CertPathErrors *this_local;
  
  __end1 = ::std::vector<bssl::CertErrors,_std::allocator<bssl::CertErrors>_>::begin
                     (&this->cert_errors_);
  errors = (CertErrors *)
           ::std::vector<bssl::CertErrors,_std::allocator<bssl::CertErrors>_>::end
                     (&this->cert_errors_);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_bssl::CertErrors_*,_std::vector<bssl::CertErrors,_std::allocator<bssl::CertErrors>_>_>
                                *)&errors);
    if (!bVar1) {
      bVar1 = CertErrors::ContainsAnyErrorWithSeverity(&this->other_errors_,severity);
      return bVar1;
    }
    this_00 = __gnu_cxx::
              __normal_iterator<const_bssl::CertErrors_*,_std::vector<bssl::CertErrors,_std::allocator<bssl::CertErrors>_>_>
              ::operator*(&__end1);
    bVar1 = CertErrors::ContainsAnyErrorWithSeverity(this_00,severity);
    if (bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_bssl::CertErrors_*,_std::vector<bssl::CertErrors,_std::allocator<bssl::CertErrors>_>_>
    ::operator++(&__end1);
  }
  return true;
}

Assistant:

bool CertPathErrors::ContainsAnyErrorWithSeverity(
    CertError::Severity severity) const {
  for (const CertErrors &errors : cert_errors_) {
    if (errors.ContainsAnyErrorWithSeverity(severity)) {
      return true;
    }
  }

  if (other_errors_.ContainsAnyErrorWithSeverity(severity)) {
    return true;
  }

  return false;
}